

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O0

int lj_cf_select(lua_State *L)

{
  int iVar1;
  lua_State *in_RDI;
  int32_t i;
  int32_t n;
  ErrMsg in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  int local_10;
  
  local_10 = (int)((long)in_RDI->top - (long)in_RDI->base >> 3);
  if (((local_10 < 1) || ((in_RDI->base->field_2).it != 0xfffffffb)) ||
     (*(char *)((ulong)(in_RDI->base->u32).lo + 0x10) != '#')) {
    iVar1 = lj_lib_checkint(in_RDI,local_10);
    if (iVar1 < 0) {
      iVar1 = local_10 + iVar1;
    }
    else if (local_10 < iVar1) {
      iVar1 = local_10;
    }
    if (iVar1 < 1) {
      lj_err_arg((lua_State *)CONCAT44(local_10,iVar1),in_stack_ffffffffffffffdc,
                 in_stack_ffffffffffffffd8);
    }
    local_10 = local_10 - iVar1;
  }
  else {
    in_RDI->top[-1].n = (double)(local_10 + -1);
    local_10 = 1;
  }
  return local_10;
}

Assistant:

LJLIB_CF(select)		LJLIB_REC(.)
{
  int32_t n = (int32_t)(L->top - L->base);
  if (n >= 1 && tvisstr(L->base) && *strVdata(L->base) == '#') {
    setintV(L->top-1, n-1);
    return 1;
  } else {
    int32_t i = lj_lib_checkint(L, 1);
    if (i < 0) i = n + i; else if (i > n) i = n;
    if (i < 1)
      lj_err_arg(L, 1, LJ_ERR_IDXRNG);
    return n - i;
  }
}